

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5047c::DFDVkFormatListTest_ReconstructDFDBytesPlanes_Test::
~DFDVkFormatListTest_ReconstructDFDBytesPlanes_Test
          (DFDVkFormatListTest_ReconstructDFDBytesPlanes_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DFDVkFormatListTest, ReconstructDFDBytesPlanes) {

    uint32_t* dfd;
    uint32_t* bdb;
    uint32_t origBytesPlane03, origBytesPlane47;

    for (uint32_t i = 0; i < sizeof(formats) / sizeof(VkFormat); i++) {
        dfd = vk2dfd(formats[i]);
        ASSERT_TRUE(dfd != NULL) << "vk2dfd failed to produce DFD for "
                                 << vkFormatString(formats[i]);
        bdb = dfd + 1;
        // There are 4 bytesPlane values in one word. Capture all at once.
        origBytesPlane03 = bdb[KHR_DF_WORD_BYTESPLANE0];
        origBytesPlane47 = bdb[KHR_DF_WORD_BYTESPLANE4];
        bdb[KHR_DF_WORD_BYTESPLANE0] = 0U;
        bdb[KHR_DF_WORD_BYTESPLANE1] = 0U;
        reconstructDFDBytesPlanesFromSamples(dfd);
        EXPECT_EQ(origBytesPlane03, bdb[KHR_DF_WORD_BYTESPLANE0]);
        EXPECT_EQ(origBytesPlane47, bdb[KHR_DF_WORD_BYTESPLANE4]);
        free(dfd);
    }

    // No need to test reconstruction for UASTC as, colorModel aside, the DFD
    // is identical to that for VK_FORMAT_ASTC_4x4_BLOCK_UNORM which has been
    // tested above.

    // Make ETC1S DFDs and test reconstruction.
    for (uint32_t sampleCount = 1; sampleCount < 3; sampleCount++) {
        uint32_t bdbSize = KHR_DF_WORD_SAMPLESTART
                           + sampleCount * KHR_DF_WORD_SAMPLEWORDS;
        bdbSize *= sizeof(uint32_t);
        uint32_t dfdSize = bdbSize + 1 * sizeof(uint32_t);
        dfd = new uint32_t[dfdSize];
        bdb = dfd + 1;

        KHR_DFDSETVAL(bdb, VENDORID, KHR_DF_VENDORID_KHRONOS);
        KHR_DFDSETVAL(bdb, DESCRIPTORTYPE, KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT);
        KHR_DFDSETVAL(bdb, VERSIONNUMBER, KHR_DF_VERSIONNUMBER_LATEST);
        KHR_DFDSETVAL(bdb, DESCRIPTORBLOCKSIZE, bdbSize);
        KHR_DFDSETVAL(bdb, MODEL, KHR_DF_MODEL_ETC1S);
        KHR_DFDSETVAL(bdb, PRIMARIES, KHR_DF_PRIMARIES_BT709);
        KHR_DFDSETVAL(bdb, TRANSFER, KHR_DF_TRANSFER_SRGB);
        KHR_DFDSETVAL(bdb, FLAGS, 0);

        bdb[KHR_DF_WORD_TEXELBLOCKDIMENSION0] =
                                3 | (3 << KHR_DF_SHIFT_TEXELBLOCKDIMENSION1);
        bdb[KHR_DF_WORD_BYTESPLANE0] = 0; /* bytesPlane3..0 = 0 */
        //KHR_DFDSETVAL(nbdb, BYTESPLANE0, 8);
        //if (sampleCoount == 2)
        //    KHR_DFDSETVAL(nbdb, BYTESPLANE1, 8);
        bdb[KHR_DF_WORD_BYTESPLANE4] = 0; /* bytesPlane7..5 = 0 */

        for (uint32_t sample = 0; sample < sampleCount; sample++) {
            uint16_t channelId, bitOffset;
            if (sample == 0) {
                bitOffset = 0;
                channelId = KHR_DF_CHANNEL_ETC1S_RGB;
            } else {
                bitOffset = 64;
                channelId = KHR_DF_CHANNEL_ETC1S_AAA;
            }
            KHR_DFDSETSVAL(bdb, sample, CHANNELID, channelId);
            KHR_DFDSETSVAL(bdb, sample, QUALIFIERS, 0);
            KHR_DFDSETSVAL(bdb, sample, SAMPLEPOSITION_ALL, 0);
            KHR_DFDSETSVAL(bdb, sample, BITOFFSET, bitOffset);
            KHR_DFDSETSVAL(bdb, sample, BITLENGTH, 63);
            KHR_DFDSETSVAL(bdb, sample, SAMPLELOWER, 0);
            KHR_DFDSETSVAL(bdb, sample, SAMPLEUPPER, UINT32_MAX);
        }
        reconstructDFDBytesPlanesFromSamples(dfd);
        EXPECT_EQ(8U, KHR_DFDVAL(bdb, BYTESPLANE0));
        if (sampleCount == 2)
            EXPECT_EQ(8U, KHR_DFDVAL(bdb, BYTESPLANE1));
        else
            EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE1));
        EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE2));
        EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE3));
        EXPECT_EQ(0U, bdb[KHR_DF_WORD_BYTESPLANE4]);

        delete[] dfd;
    }
}